

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_sad_avx2.c
# Opt level: O0

void sad32x4(uint16_t *src_ptr,int src_stride,uint16_t *ref_ptr,int ref_stride,uint16_t *sec_ptr,
            __m256i *sad_acc)

{
  undefined1 auVar1 [32];
  int in_ECX;
  undefined1 (*in_RDX) [32];
  undefined1 (*in_R8) [32];
  int row_sections;
  __m256i r [4];
  __m256i s [4];
  int local_2e4;
  undefined1 auVar2 [24];
  undefined1 (*local_1c8) [32];
  undefined1 (*local_1b8) [32];
  
  local_1c8 = in_R8;
  local_1b8 = in_RDX;
  for (local_2e4 = 0; local_2e4 < 2; local_2e4 = local_2e4 + 1) {
    auVar2 = SUB3224(local_1b8[1],0);
    if (local_1c8 != (undefined1 (*) [32])0x0) {
      vpavgw_avx2(*local_1b8,*local_1c8);
      auVar1 = vpavgw_avx2(local_1b8[1],local_1c8[1]);
      auVar2 = auVar1._0_24_;
      vpavgw_avx2(*(undefined1 (*) [32])(*local_1b8 + (long)in_ECX * 2),local_1c8[2]);
      vpavgw_avx2(*(undefined1 (*) [32])(local_1b8[1] + (long)in_ECX * 2),local_1c8[3]);
      local_1c8 = local_1c8 + 4;
    }
    highbd_sad16x4_core_avx2(auVar2._16_8_,auVar2._8_8_,auVar2._0_8_);
    local_1b8 = (undefined1 (*) [32])(*local_1b8 + (long)(in_ECX << 1) * 2);
  }
  return;
}

Assistant:

static void sad32x4(const uint16_t *src_ptr, int src_stride,
                    const uint16_t *ref_ptr, int ref_stride,
                    const uint16_t *sec_ptr, __m256i *sad_acc) {
  __m256i s[4], r[4];
  int row_sections = 0;

  while (row_sections < 2) {
    s[0] = _mm256_loadu_si256((const __m256i *)src_ptr);
    s[1] = _mm256_loadu_si256((const __m256i *)(src_ptr + 16));
    s[2] = _mm256_loadu_si256((const __m256i *)(src_ptr + src_stride));
    s[3] = _mm256_loadu_si256((const __m256i *)(src_ptr + src_stride + 16));

    r[0] = _mm256_loadu_si256((const __m256i *)ref_ptr);
    r[1] = _mm256_loadu_si256((const __m256i *)(ref_ptr + 16));
    r[2] = _mm256_loadu_si256((const __m256i *)(ref_ptr + ref_stride));
    r[3] = _mm256_loadu_si256((const __m256i *)(ref_ptr + ref_stride + 16));

    if (sec_ptr) {
      r[0] =
          _mm256_avg_epu16(r[0], _mm256_loadu_si256((const __m256i *)sec_ptr));
      r[1] = _mm256_avg_epu16(
          r[1], _mm256_loadu_si256((const __m256i *)(sec_ptr + 16)));
      r[2] = _mm256_avg_epu16(
          r[2], _mm256_loadu_si256((const __m256i *)(sec_ptr + 32)));
      r[3] = _mm256_avg_epu16(
          r[3], _mm256_loadu_si256((const __m256i *)(sec_ptr + 48)));
      sec_ptr += 32 << 1;
    }
    highbd_sad16x4_core_avx2(s, r, sad_acc);

    row_sections += 1;
    src_ptr += src_stride << 1;
    ref_ptr += ref_stride << 1;
  }
}